

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void NULLC::FreePending(void)

{
  int *ptr;
  ulong uVar1;
  Range *key;
  long lVar2;
  
  if (DAT_0042eed4 != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      ptr = *(int **)(blocksToFree + lVar2);
      if ((*(byte *)(ptr + 1) & 3) == 0) {
        key = (Range *)(blocksToFree + lVar2);
        usedMemory = usedMemory - *ptr;
        alignedDealloc(ptr);
        bigBlocks._24_8_ =
             Tree<NULLC::Range>::erase
                       ((Tree<NULLC::Range> *)bigBlocks,(node_type *)bigBlocks._24_8_,key);
      }
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar1 < DAT_0042eed4);
  }
  DAT_0042eed4 = 0;
  ObjectBlockPool<8,_8192>::FreePending((ObjectBlockPool<8,_8192> *)pool8,(uint *)&usedMemory);
  ObjectBlockPool<16,_4096>::FreePending((ObjectBlockPool<16,_4096> *)pool16,(uint *)&usedMemory);
  ObjectBlockPool<32,_2048>::FreePending((ObjectBlockPool<32,_2048> *)pool32,(uint *)&usedMemory);
  ObjectBlockPool<64,_1024>::FreePending((ObjectBlockPool<64,_1024> *)pool64,(uint *)&usedMemory);
  ObjectBlockPool<128,_512>::FreePending((ObjectBlockPool<128,_512> *)pool128,(uint *)&usedMemory);
  ObjectBlockPool<256,_256>::FreePending((ObjectBlockPool<256,_256> *)pool256,(uint *)&usedMemory);
  ObjectBlockPool<512,_128>::FreePending((ObjectBlockPool<512,_128> *)pool512,(uint *)&usedMemory);
  return;
}

Assistant:

void NULLC::FreePending()
{
	for(unsigned i = 0; i < blocksToFree.size(); i++)
	{
		Range &curr = blocksToFree[i];

		void *block = curr.start;

		markerType &marker = *(markerType*)((char*)block + 4);

		// Check flags again, finalizers might have some objects reachable
		if(!(marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)))
		{
			unsigned size = *(unsigned int*)block;

			usedMemory -= size;

			NULLC::alignedDealloc(block);

			bigBlocks.erase(curr);
		}
	}

	blocksToFree.clear();

	pool8.FreePending(usedMemory);
	pool16.FreePending(usedMemory);
	pool32.FreePending(usedMemory);
	pool64.FreePending(usedMemory);
	pool128.FreePending(usedMemory);
	pool256.FreePending(usedMemory);
	pool512.FreePending(usedMemory);
}